

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

StatementMap * __thiscall
Js::FunctionBody::GetMatchingStatementMapFromByteCode
          (FunctionBody *this,int byteCodeOffset,bool ignoreSubexpressions)

{
  int iVar1;
  StatementMap *pSVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  undefined4 *puVar6;
  Type *pTVar7;
  int iVar8;
  StatementMap *local_40;
  
  this_00 = (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)FunctionProxy::GetAuxPtrWithLock((FunctionProxy *)this,StatementMaps);
  if (this_00 !=
      (List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    if ((this->m_sourceInfo).pSpanSequence != (Type)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                  ,0xbf4,"(m_sourceInfo.pSpanSequence == nullptr)",
                                  "m_sourceInfo.pSpanSequence == nullptr");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    iVar8 = (this_00->
            super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>)
            .count;
    bVar4 = 0 < iVar8;
    if (0 < iVar8) {
      iVar8 = 0;
      do {
        pTVar7 = JsUtil::
                 List<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item(this_00,iVar8);
        pSVar2 = pTVar7->ptr;
        if (((ignoreSubexpressions) && (pSVar2->isSubexpression != false)) ||
           (bVar5 = regex::Interval::Includes(&pSVar2->byteCodeSpan,byteCodeOffset), !bVar5)) {
          bVar5 = true;
        }
        else {
          bVar5 = false;
          local_40 = pSVar2;
        }
        if (!bVar5) break;
        iVar8 = iVar8 + 1;
        iVar1 = (this_00->
                super_ReadOnlyList<Js::FunctionBody::StatementMap_*,_Memory::Recycler,_DefaultComparer>
                ).count;
        bVar4 = iVar8 < iVar1;
      } while (iVar8 < iVar1);
    }
    if (bVar4) {
      return local_40;
    }
  }
  return (StatementMap *)0x0;
}

Assistant:

FunctionBody::StatementMap* FunctionBody::GetMatchingStatementMapFromByteCode(int byteCodeOffset, bool ignoreSubexpressions /* = false */)
    {
        StatementMapList * pStatementMaps = this->GetStatementMaps();
        if (pStatementMaps)
        {
            Assert(m_sourceInfo.pSpanSequence == nullptr);
            for (int index = 0; index < pStatementMaps->Count(); index++)
            {
                FunctionBody::StatementMap* pStatementMap = pStatementMaps->Item(index);

                if (!(ignoreSubexpressions && pStatementMap->isSubexpression) &&  pStatementMap->byteCodeSpan.Includes(byteCodeOffset))
                {
                    return pStatementMap;
                }
            }
        }
        return nullptr;
    }